

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encrypt.c
# Opt level: O2

void HPDF_MD5Update(HPDF_MD5Context *ctx,HPDF_BYTE *buf,HPDF_UINT32 len)

{
  uint uVar1;
  HPDF_BYTE *in;
  
  uVar1 = ctx->bits[0];
  ctx->bits[0] = len * 8 + uVar1;
  ctx->bits[1] = ctx->bits[1] + (len >> 0x1d) + (uint)CARRY4(len * 8,uVar1);
  uVar1 = uVar1 >> 3 & 0x3f;
  if (uVar1 != 0) {
    in = ctx->in + uVar1;
    uVar1 = 0x40 - uVar1;
    if (len < uVar1) goto LAB_0011c7c4;
    HPDF_MemCpy(in,buf,uVar1);
    MD5ByteReverse(ctx->in,0x10);
    MD5Transform(ctx->buf,(HPDF_UINT32 *)ctx->in);
    buf = buf + uVar1;
    len = len - uVar1;
  }
  in = ctx->in;
  for (; 0x3f < len; len = len - 0x40) {
    HPDF_MemCpy(in,buf,0x40);
    MD5ByteReverse(in,0x10);
    MD5Transform(ctx->buf,(HPDF_UINT32 *)in);
    buf = buf + 0x40;
  }
LAB_0011c7c4:
  HPDF_MemCpy(in,buf,len);
  return;
}

Assistant:

void
HPDF_MD5Update  (struct HPDF_MD5Context *ctx,
                 const HPDF_BYTE        *buf,
                 HPDF_UINT32            len)
{
    HPDF_UINT32 t;

    /* Update bitcount */

    t = ctx->bits[0];
    if ((ctx->bits[0] = t + ((HPDF_UINT32) len << 3)) < t)
        ctx->bits[1]++;     /* Carry from low to high */
    ctx->bits[1] += len >> 29;

    t = (t >> 3) & 0x3f; /* Bytes already in shsInfo->data */

    /* Handle any leading odd-sized chunks */

    if (t) {
        HPDF_BYTE *p = (HPDF_BYTE *) ctx->in + t;

        t = 64 - t;
        if (len < t)
        {
            HPDF_MemCpy (p, buf, len);
            return;
        }
        HPDF_MemCpy (p, buf, t);
        MD5ByteReverse (ctx->in, 16);
        MD5Transform (ctx->buf, (HPDF_UINT32 *) ctx->in);
        buf += t;
        len -= t;
    }
    /* Process data in 64-byte chunks */

    while (len >= 64) {
        HPDF_MemCpy (ctx->in, buf, 64);
        MD5ByteReverse (ctx->in, 16);
        MD5Transform (ctx->buf, (HPDF_UINT32 *) ctx->in);
        buf += 64;
        len -= 64;
    }

    /* Handle any remaining bytes of data. */

    HPDF_MemCpy (ctx->in, buf, len);
}